

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-intrusive-list.cc
# Opt level: O0

void __thiscall
IntrusiveListTest_erase_range_Test::TestBody(IntrusiveListTest_erase_range_Test *this)

{
  initializer_list<int> __l;
  initializer_list<int> __l_00;
  initializer_list<int> __l_01;
  initializer_list<int> __l_02;
  vector<int,_std::allocator<int>_> local_2a0;
  iterator local_288;
  iterator local_278;
  iterator local_268;
  allocator<int> local_251;
  int local_250 [2];
  iterator local_248;
  size_type local_240;
  vector<int,_std::allocator<int>_> local_238;
  iterator local_220;
  iterator local_210;
  iterator local_200;
  iterator local_1f0;
  iterator local_1e0;
  allocator<int> local_1c9;
  int local_1c8 [4];
  iterator local_1b8;
  size_type local_1b0;
  vector<int,_std::allocator<int>_> local_1a8;
  iterator local_190;
  iterator local_180;
  iterator local_170;
  iterator local_160;
  allocator<int> local_14d;
  int local_14c [5];
  iterator local_138;
  size_type local_130;
  vector<int,_std::allocator<int>_> local_128;
  iterator local_110;
  iterator local_100;
  iterator local_f0;
  iterator local_e0;
  iterator local_d0;
  iterator local_c0;
  iterator local_b0;
  iterator local_a0;
  iterator local_90;
  iterator local_80;
  allocator<int> local_69;
  int local_68 [6];
  iterator local_50;
  size_type local_48;
  vector<int,_std::allocator<int>_> local_40;
  undefined1 local_28 [8];
  TestObjectList list;
  IntrusiveListTest_erase_range_Test *this_local;
  
  local_68[0] = 1;
  local_68[1] = 2;
  local_68[2] = 3;
  local_68[3] = 4;
  local_68[4] = 5;
  local_68[5] = 6;
  local_50 = local_68;
  local_48 = 6;
  list.size_ = (size_t)this;
  std::allocator<int>::allocator(&local_69);
  __l_02._M_len = local_48;
  __l_02._M_array = local_50;
  std::vector<int,_std::allocator<int>_>::vector(&local_40,__l_02,&local_69);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::NewList
            ((TestObjectList *)local_28,&this->super_IntrusiveListTest,&local_40);
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  std::allocator<int>::~allocator(&local_69);
  local_80 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_90 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_a0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_80,
                        local_90);
  local_b0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_c0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_d0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_b0,
                        local_c0);
  local_e0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                       ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_100 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_f0 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                       (local_100,1);
  local_110 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_e0,
                         local_f0);
  local_14c[0] = 2;
  local_14c[1] = 3;
  local_14c[2] = 4;
  local_14c[3] = 5;
  local_14c[4] = 6;
  local_138 = local_14c;
  local_130 = 5;
  std::allocator<int>::allocator(&local_14d);
  __l_01._M_len = local_130;
  __l_01._M_array = local_138;
  std::vector<int,_std::allocator<int>_>::vector(&local_128,__l_01,&local_14d);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_128);
  std::vector<int,_std::allocator<int>_>::~vector(&local_128);
  std::allocator<int>::~allocator(&local_14d);
  local_170 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_160 = std::prev<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_170,1);
  local_180 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_190 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_160,
                         local_180);
  local_1c8[0] = 2;
  local_1c8[1] = 3;
  local_1c8[2] = 4;
  local_1c8[3] = 5;
  local_1b8 = local_1c8;
  local_1b0 = 4;
  std::allocator<int>::allocator(&local_1c9);
  __l_00._M_len = local_1b0;
  __l_00._M_array = local_1b8;
  std::vector<int,_std::allocator<int>_>::vector(&local_1a8,__l_00,&local_1c9);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_1a8);
  std::vector<int,_std::allocator<int>_>::~vector(&local_1a8);
  std::allocator<int>::~allocator(&local_1c9);
  local_1f0 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_1e0 = std::next<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_1f0,1);
  local_210 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_200 = std::prev<wabt::intrusive_list<(anonymous_namespace)::TestObject>::iterator>
                        (local_210,1);
  local_220 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_1e0,
                         local_200);
  local_250[0] = 2;
  local_250[1] = 5;
  local_248 = local_250;
  local_240 = 2;
  std::allocator<int>::allocator(&local_251);
  __l._M_len = local_240;
  __l._M_array = local_248;
  std::vector<int,_std::allocator<int>_>::vector(&local_238,__l,&local_251);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_238);
  std::vector<int,_std::allocator<int>_>::~vector(&local_238);
  std::allocator<int>::~allocator(&local_251);
  local_268 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::begin
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_278 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::end
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  local_288 = wabt::intrusive_list<(anonymous_namespace)::TestObject>::erase
                        ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28,local_268,
                         local_278);
  memset(&local_2a0,0,0x18);
  std::vector<int,_std::allocator<int>_>::vector(&local_2a0);
  anon_unknown.dwarf_5bdeb::IntrusiveListTest::AssertListEq
            (&this->super_IntrusiveListTest,(TestObjectList *)local_28,&local_2a0);
  std::vector<int,_std::allocator<int>_>::~vector(&local_2a0);
  wabt::intrusive_list<(anonymous_namespace)::TestObject>::~intrusive_list
            ((intrusive_list<(anonymous_namespace)::TestObject> *)local_28);
  return;
}

Assistant:

TEST_F(IntrusiveListTest, erase_range) {
  TestObjectList list = NewList({1, 2, 3, 4, 5, 6});

  // OK to erase an empty range.
  list.erase(list.begin(), list.begin());
  list.erase(list.end(), list.end());

  // Erase the first element (1).
  list.erase(list.begin(), std::next(list.begin()));
  AssertListEq(list, {2, 3, 4, 5, 6});

  // Erase the last element (6).
  list.erase(std::prev(list.end()), list.end());
  AssertListEq(list, {2, 3, 4, 5});

  // Erase [3, 4] => [2, 5]
  list.erase(std::next(list.begin()), std::prev(list.end()));
  AssertListEq(list, {2, 5});

  // Erase the rest.
  list.erase(list.begin(), list.end());
  AssertListEq(list, {});
}